

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::debug_logger<true>::log<int,int,long_double,long_double,long_double>
          (debug_logger<true> *this,string_view fmt,int *args,int *args_1,longdouble *args_2,
          longdouble *args_3,longdouble *args_4)

{
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_str = fmt._M_str;
  local_10._M_len = fmt._M_len;
  ::fmt::v7::
  print<std::basic_string_view<char,std::char_traits<char>>,int_const&,int_const&,long_double_const&,long_double_const&,long_double_const&,char>
            (this->ofs,&local_10,args,args_1,args_2,args_3,args_4);
  return;
}

Assistant:

void log([[maybe_unused]] const std::string_view fmt,
             [[maybe_unused]] const Args&... args) const noexcept
    {
        if constexpr (debug) {
            fmt::print(ofs, fmt, args...);
        }
    }